

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O1

int mbhitm(monst *mtmp,obj *otmp)

{
  ushort uVar1;
  boolean bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  obj *poVar7;
  int tmp;
  int tmp_1;
  int iVar8;
  
  if ((mtmp != &youmonst) && (mtmp->field_0x62 = mtmp->field_0x62 & 0xf7, mtmp->m_ap_type != '\0'))
  {
    seemimic(mtmp);
  }
  uVar1 = otmp->otyp;
  if (0x1c9 < uVar1) {
    if (uVar1 != 0x1ca) {
      if (uVar1 != 0x1cb) {
        return 0;
      }
      if (mtmp == &youmonst) {
        if (zap_oseen != '\0') {
          discover_object(0x1cb,'\x01','\x01');
        }
        tele((char *)0x0);
        return 0;
      }
      if (((mtmp->field_0x63 & 0x10) == 0) ||
         (pcVar6 = in_rooms(level,mtmp->mx,mtmp->my,10), *pcVar6 == '\0')) {
        bVar2 = tele_restrict(mtmp);
        if (bVar2 != '\0') {
          return 0;
        }
        rloc(level,mtmp,'\0');
        return 0;
      }
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
        pcVar6 = Monnam(mtmp);
        pline("%s resists the magic!",pcVar6);
      }
      mtmp->field_0x62 = mtmp->field_0x62 & 0xf7;
      if (mtmp->m_ap_type == '\0') {
        return 0;
      }
      seemimic(mtmp);
      return 0;
    }
LAB_001f8e05:
    cancel_monst(mtmp,otmp,'\0','\x01','\0');
    return 0;
  }
  if (uVar1 == 0x1a1) goto LAB_001f8e05;
  if (uVar1 != 0x1c4) {
    return 0;
  }
  if (mtmp == &youmonst) {
    if (zap_oseen != '\0') {
      discover_object(0x1c4,'\x01','\x01');
    }
    if ((u.uprops[0x2c].extrinsic == 0) &&
       ((u.umonnum == u.umonster || (bVar2 = resists_magm(&youmonst), bVar2 == '\0')))) {
      uVar3 = mt_random();
      if (u.uac + 9 <= (int)(uVar3 % 0x14)) {
        pcVar6 = "The wand misses you.";
        goto LAB_001f8e8e;
      }
      pline("The wand hits you!");
      uVar3 = 2;
      iVar5 = -2;
      do {
        uVar4 = mt_random();
        uVar3 = uVar3 + uVar4 % 0xc;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
      uVar4 = uVar3 + 1 >> 1;
      if (u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) {
        uVar4 = uVar3;
      }
      losehp(uVar4,"wand",0);
    }
    else {
      shieldeff(u.ux,u.uy);
      pcVar6 = "Boing!";
LAB_001f8e8e:
      pline(pcVar6);
    }
    stop_occupation();
    nomul(0,(char *)0x0);
  }
  else {
    bVar2 = resists_magm(mtmp);
    if (bVar2 == '\0') {
      uVar3 = mt_random();
      iVar5 = find_mac(mtmp);
      if ((int)(uVar3 % 0x14) < iVar5 + 9) {
        iVar5 = 2;
        iVar8 = -2;
        do {
          uVar3 = mt_random();
          iVar5 = iVar5 + uVar3 % 0xc;
          iVar8 = iVar8 + 1;
        } while (iVar8 != 0);
        pcVar6 = exclam(iVar5);
        hit("wand",'\0',mtmp,pcVar6);
        resist(mtmp,otmp->oclass,iVar5,1);
      }
      else {
        miss("wand",mtmp);
      }
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) && (zap_oseen != '\0')) {
        discover_object(0x1c4,'\x01','\x01');
      }
    }
    else {
      shieldeff(mtmp->mx,mtmp->my);
      pline("Boing!");
    }
  }
  if (mtmp->mhp < 1) {
    return 0;
  }
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))))
    goto LAB_001f91c3;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 == '\0') goto LAB_001f91c3;
  }
  uVar3 = *(uint *)&mtmp->field_0x60;
  if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar3 & 0x280) != 0) goto LAB_001f91c3;
  }
  else if (((uVar3 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_001f91c3;
  if ((u._1052_1_ & 0x20) == 0) {
    return 0;
  }
LAB_001f91c3:
  if (((mtmp->data->mflags1 & 0x10000) == 0) &&
     ((poVar7 = which_armor(mtmp,4), poVar7 == (obj *)0x0 ||
      (poVar7 = which_armor(mtmp,4), poVar7->otyp != 0x4f)))) {
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
        ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
          (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
          youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) {
      return 0;
    }
    if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
       (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41)) {
      return 0;
    }
  }
  if (u.uprops[0x42].intrinsic != 0) {
    return 0;
  }
  if (u.uprops[0x42].extrinsic != 0) {
    return 0;
  }
  bVar2 = match_warn_of_mon(mtmp);
  if (bVar2 != '\0') {
    return 0;
  }
  map_invisible(bhitpos.x,bhitpos.y);
  return 0;
}

Assistant:

static int mbhitm(struct monst *mtmp, struct obj *otmp)
{
	int tmp;

	boolean reveal_invis = FALSE;
	if (mtmp != &youmonst) {
		mtmp->msleeping = 0;
		if (mtmp->m_ap_type) seemimic(mtmp);
	}
	switch(otmp->otyp) {
	case WAN_STRIKING:
		reveal_invis = TRUE;
		if (mtmp == &youmonst) {
			if (zap_oseen) makeknown(WAN_STRIKING);
			if (Antimagic) {
			    shieldeff(u.ux, u.uy);
			    pline("Boing!");
			} else if (rnd(20) < 10 + u.uac) {
			    pline("The wand hits you!");
			    tmp = dice(2,12);
			    if (Half_spell_damage) tmp = (tmp+1) / 2;
			    losehp(tmp, "wand", KILLED_BY_AN);
			} else pline("The wand misses you.");
			stop_occupation();
			nomul(0, NULL);
		} else if (resists_magm(mtmp)) {
			shieldeff(mtmp->mx, mtmp->my);
			pline("Boing!");
		} else if (rnd(20) < 10+find_mac(mtmp)) {
			tmp = dice(2,12);
			hit("wand", FALSE, mtmp, exclam(tmp));
			resist(mtmp, otmp->oclass, tmp, TELL);
			if (cansee(mtmp->mx, mtmp->my) && zap_oseen)
				makeknown(WAN_STRIKING);
		} else {
			miss("wand", mtmp);
			if (cansee(mtmp->mx, mtmp->my) && zap_oseen)
				makeknown(WAN_STRIKING);
		}
		break;
	case WAN_TELEPORTATION:
		if (mtmp == &youmonst) {
			if (zap_oseen) makeknown(WAN_TELEPORTATION);
			tele(NULL);
		} else {
			/* for consistency with zap.c, don't identify */
			if (mtmp->ispriest &&
				*in_rooms(level, mtmp->mx, mtmp->my, TEMPLE)) {
			    if (cansee(mtmp->mx, mtmp->my))
				pline("%s resists the magic!", Monnam(mtmp));
			    mtmp->msleeping = 0;
			    if (mtmp->m_ap_type) seemimic(mtmp);
			} else if (!tele_restrict(mtmp))
			    rloc(level, mtmp, FALSE);
		}
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_monst(mtmp, otmp, FALSE, TRUE, FALSE);
		break;
	}
	if (reveal_invis) {
	    if (mtmp->mhp > 0 && cansee(bhitpos.x,bhitpos.y)
							&& !canspotmon(level, mtmp))
		map_invisible(bhitpos.x, bhitpos.y);
	}
	return 0;
}